

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

void __thiscall
ON_Xform::Rotation(ON_Xform *this,ON_3dPoint *P0,ON_3dVector *X0,ON_3dVector *Y0,ON_3dVector *Z0,
                  ON_3dPoint *P1,ON_3dVector *X1,ON_3dVector *Y1,ON_3dVector *Z1)

{
  ON_Xform local_2e8;
  ON_Xform local_268;
  ON_3dVector local_1e8;
  undefined1 local_1d0 [8];
  ON_Xform T1;
  ON_Xform R;
  undefined1 local_b8 [8];
  ON_Xform T0;
  ON_3dPoint *P1_local;
  ON_3dVector *Z0_local;
  ON_3dVector *Y0_local;
  ON_3dVector *X0_local;
  ON_3dPoint *P0_local;
  ON_Xform *this_local;
  
  T0.m_xform[3][3] = (double)P1;
  ON_3dPoint::operator-((ON_3dVector *)(R.m_xform[3] + 3),&ON_3dPoint::Origin,P0);
  TranslationTransformation((ON_Xform *)local_b8,(ON_3dVector *)(R.m_xform[3] + 3));
  ON_Xform((ON_Xform *)(T1.m_xform[3] + 3));
  Rotation((ON_Xform *)(T1.m_xform[3] + 3),X0,Y0,Z0,X1,Y1,Z1);
  ON_3dPoint::operator-(&local_1e8,(ON_3dPoint *)T0.m_xform[3][3],&ON_3dPoint::Origin);
  TranslationTransformation((ON_Xform *)local_1d0,&local_1e8);
  operator*(&local_2e8,(ON_Xform *)local_1d0,(ON_Xform *)(T1.m_xform[3] + 3));
  operator*(&local_268,&local_2e8,(ON_Xform *)local_b8);
  memcpy(this,&local_268,0x80);
  return;
}

Assistant:

void ON_Xform::Rotation(   // (not strictly a rotation)
                            // transformation maps P0 to P1, P0+X0 to P1+X1, ...
  const ON_3dPoint&   P0,  // initial frame center
  const ON_3dVector&  X0, // initial frame X
  const ON_3dVector&  Y0, // initial frame Y
  const ON_3dVector&  Z0, // initial frame Z
  const ON_3dPoint&   P1,  // final frame center
  const ON_3dVector&  X1, // final frame X
  const ON_3dVector&  Y1, // final frame Y
  const ON_3dVector&  Z1  // final frame Z
  )
{
  // transformation maps P0 to P1, P0+X0 to P1+X1, ...

  // T0 translates point P0 to (0,0,0)
  const ON_Xform T0(ON_Xform::TranslationTransformation(ON_3dPoint::Origin - P0));

  ON_Xform R;
  R.Rotation(X0,Y0,Z0,X1,Y1,Z1);

  // T1 translates (0,0,0) to point P1
  ON_Xform T1(ON_Xform::TranslationTransformation(P1 - ON_3dPoint::Origin));

  *this = T1*R*T0;
}